

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::commandHadError
          (CAPIBuildSystemFrontendDelegate *this,Command *command,StringRef message)

{
  undefined1 local_48 [8];
  llb_data_t cMessage;
  Command *command_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  StringRef message_local;
  
  local_48 = (undefined1  [8])message.Length;
  cMessage.length = (uint64_t)message.Data;
  if ((this->cAPIDelegate).command_had_error !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)0x0) {
    message_local.Length = (size_t)&this_local;
    cMessage.data = (uint8_t *)command;
    this_local = (CAPIBuildSystemFrontendDelegate *)cMessage.length;
    message_local.Data = (char *)local_48;
    (*(this->cAPIDelegate).command_had_error)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
               (llb_data_t *)local_48);
  }
  return;
}

Assistant:

virtual void commandHadError(Command* command, StringRef message) override {
    if (cAPIDelegate.command_had_error) {
      llb_data_t cMessage { message.size(), (const uint8_t*) message.data() };
      cAPIDelegate.command_had_error(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          &cMessage);
    }
  }